

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11disp.c
# Opt level: O1

X11Display * x11_setup_display(char *display,Conf *conf,char **error_msg)

{
  _Bool _Var1;
  int iVar2;
  X11Display *disp;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  SockAddr *pSVar7;
  SockAddr *cmp;
  _STACK *p_Var8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  
  disp = (X11Display *)safemalloc(1,0x50,0);
  *error_msg = (char *)0x0;
  if ((display == (char *)0x0) || (*display == '\0')) {
    pcVar3 = platform_get_x_display();
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      safefree(pcVar3);
      display = ":0";
      goto LAB_00138d8c;
    }
  }
  else {
LAB_00138d8c:
    pcVar3 = dupstr(display);
  }
  if (*pcVar3 == '/') {
    disp->unixsocketpath = pcVar3;
    disp->unixdomain = true;
    disp->hostname = (char *)0x0;
    disp->displaynum = -1;
    disp->screennum = 0;
    disp->addr = (SockAddr *)0x0;
  }
  else {
    pcVar4 = host_strrchr(pcVar3,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar6 = dupprintf("display name \'%s\' has no \':number\' suffix",pcVar3);
      *error_msg = pcVar6;
      safefree(disp);
    }
    else {
      pcVar6 = pcVar4 + 1;
      *pcVar4 = '\0';
      pcVar5 = strchr(pcVar6,0x2e);
      iVar11 = 0;
      if (pcVar5 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = pcVar5 + 1;
        *pcVar5 = '\0';
      }
      iVar2 = atoi(pcVar6);
      disp->displaynum = iVar2;
      if (pcVar10 != (char *)0x0) {
        iVar11 = atoi(pcVar10);
      }
      disp->screennum = iVar11;
      if ((pcVar3 < pcVar6) && (pcVar6 = strchr(pcVar3,0x2f), pcVar6 != (char *)0x0)) {
        *pcVar6 = '\0';
        pcVar5 = pcVar3;
        pcVar6 = pcVar6 + 1;
      }
      else {
        pcVar5 = (char *)0x0;
        pcVar6 = pcVar3;
      }
      if (*pcVar6 == '\0') {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = dupstr(pcVar6);
      }
      disp->hostname = pcVar10;
      if (pcVar5 == (char *)0x0) {
        if ((*pcVar6 == '\0') || (iVar11 = strcmp(pcVar6,"unix"), iVar11 == 0)) {
          _Var1 = true;
        }
        else {
          _Var1 = false;
        }
      }
      else {
        iVar11 = strcmp(pcVar5,"local");
        if (iVar11 == 0) {
          _Var1 = true;
        }
        else {
          iVar11 = strcmp(pcVar5,"unix");
          _Var1 = iVar11 == 0;
        }
      }
      disp->unixdomain = _Var1;
      if ((pcVar10 == (char *)0x0) && (disp->unixdomain == false)) {
        pcVar6 = dupstr("localhost");
        disp->hostname = pcVar6;
      }
      disp->unixsocketpath = (char *)0x0;
      disp->addr = (SockAddr *)0x0;
    }
    safefree(pcVar3);
    if (pcVar4 == (char *)0x0) {
      return (X11Display *)0x0;
    }
  }
  if (disp->unixdomain == false) {
    iVar11 = disp->displaynum + 6000;
    disp->port = iVar11;
    pSVar7 = name_lookup(disp->hostname,iVar11,&disp->realhost,conf,0,(LogContext *)0x0,(char *)0x0)
    ;
    disp->addr = pSVar7;
    pcVar3 = sk_addr_error(pSVar7);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = dupprintf("unable to resolve host name \'%s\' in display name",disp->hostname);
      *error_msg = pcVar3;
      sk_addr_free(disp->addr);
      safefree(disp->hostname);
      safefree(disp->unixsocketpath);
      safefree(disp);
      return (X11Display *)0x0;
    }
  }
  if ((disp->unixdomain == false) && (_Var1 = sk_address_is_local(disp->addr), _Var1)) {
    pSVar7 = platform_get_x11_unix_address((char *)0x0,disp->displaynum);
    pcVar3 = sk_addr_error(pSVar7);
    if (pcVar3 == (char *)0x0) {
      cmp = sk_addr_dup(pSVar7);
      p_Var8 = sk_new((cmp *)cmp);
      lVar9 = (**(code **)(*(long *)p_Var8 + 0x30))(p_Var8);
      (**(code **)(*(long *)p_Var8 + 8))(p_Var8);
      if (lVar9 == 0) {
        sk_addr_free(disp->addr);
        disp->unixdomain = true;
        disp->addr = pSVar7;
        goto LAB_0013901e;
      }
    }
    sk_addr_free(pSVar7);
  }
LAB_0013901e:
  if (disp->unixdomain == true) {
    if (disp->addr == (SockAddr *)0x0) {
      pSVar7 = platform_get_x11_unix_address(disp->unixsocketpath,disp->displaynum);
      disp->addr = pSVar7;
    }
    if (disp->unixsocketpath == (char *)0x0) {
      pcVar3 = dupprintf("unix:%d",(ulong)(uint)disp->displaynum);
    }
    else {
      pcVar3 = dupstr(disp->unixsocketpath);
    }
    disp->realhost = pcVar3;
    disp->port = 0;
  }
  disp->localauthproto = 0;
  disp->localauthdata = (uchar *)0x0;
  disp->localauthdatalen = 0;
  platform_get_x11_auth(disp,conf);
  return disp;
}

Assistant:

struct X11Display *x11_setup_display(const char *display, Conf *conf,
                                     char **error_msg)
{
    struct X11Display *disp = snew(struct X11Display);
    char *localcopy;

    *error_msg = NULL;

    if (!display || !*display) {
        localcopy = platform_get_x_display();
        if (!localcopy || !*localcopy) {
            sfree(localcopy);
            localcopy = dupstr(":0");  /* plausible default for any platform */
        }
    } else
        localcopy = dupstr(display);

    /*
     * Parse the display name.
     *
     * We expect this to have one of the following forms:
     *
     *  - the standard X format which looks like
     *    [ [ protocol '/' ] host ] ':' displaynumber [ '.' screennumber ]
     *    (X11 also permits a double colon to indicate DECnet, but
     *    that's not our problem, thankfully!)
     *
     *  - only seen in the wild on MacOS (so far): a pathname to a
     *    Unix-domain socket, which will typically and confusingly
     *    end in ":0", and which I'm currently distinguishing from
     *    the standard scheme by noting that it starts with '/'.
     */
    if (localcopy[0] == '/') {
        disp->unixsocketpath = localcopy;
        disp->unixdomain = true;
        disp->hostname = NULL;
        disp->displaynum = -1;
        disp->screennum = 0;
        disp->addr = NULL;
    } else {
        char *colon, *dot, *slash;
        char *protocol, *hostname;

        colon = host_strrchr(localcopy, ':');
        if (!colon) {
            *error_msg = dupprintf("display name '%s' has no ':number'"
                                   " suffix", localcopy);

            sfree(disp);
            sfree(localcopy);
            return NULL;
        }

        *colon++ = '\0';
        dot = strchr(colon, '.');
        if (dot)
            *dot++ = '\0';

        disp->displaynum = atoi(colon);
        if (dot)
            disp->screennum = atoi(dot);
        else
            disp->screennum = 0;

        protocol = NULL;
        hostname = localcopy;
        if (colon > localcopy) {
            slash = strchr(localcopy, '/');
            if (slash) {
                *slash++ = '\0';
                protocol = localcopy;
                hostname = slash;
            }
        }

        disp->hostname = *hostname ? dupstr(hostname) : NULL;

        if (protocol)
            disp->unixdomain = (!strcmp(protocol, "local") ||
                                !strcmp(protocol, "unix"));
        else if (!*hostname || !strcmp(hostname, "unix"))
            disp->unixdomain = platform_uses_x11_unix_by_default;
        else
            disp->unixdomain = false;

        if (!disp->hostname && !disp->unixdomain)
            disp->hostname = dupstr("localhost");

        disp->unixsocketpath = NULL;
        disp->addr = NULL;

        sfree(localcopy);
    }

    /*
     * Look up the display hostname, if we need to.
     */
    if (!disp->unixdomain) {
        const char *err;

        disp->port = 6000 + disp->displaynum;
        disp->addr = name_lookup(disp->hostname, disp->port,
                                 &disp->realhost, conf, ADDRTYPE_UNSPEC,
                                 NULL, NULL);

        if ((err = sk_addr_error(disp->addr)) != NULL) {
            *error_msg = dupprintf("unable to resolve host name '%s' in "
                                   "display name", disp->hostname);

            sk_addr_free(disp->addr);
            sfree(disp->hostname);
            sfree(disp->unixsocketpath);
            sfree(disp);
            return NULL;
        }
    }

    /*
     * Try upgrading an IP-style localhost display to a Unix-socket
     * display (as the standard X connection libraries do).
     */
    if (!disp->unixdomain && sk_address_is_local(disp->addr)) {
        SockAddr *ux = platform_get_x11_unix_address(NULL, disp->displaynum);
        const char *err = sk_addr_error(ux);
        if (!err) {
            /* Create trial connection to see if there is a useful Unix-domain
             * socket */
            Socket *s = sk_new(sk_addr_dup(ux), 0, false, false,
                               false, false, nullplug);
            err = sk_socket_error(s);
            sk_close(s);
        }
        if (err) {
            sk_addr_free(ux);
        } else {
            sk_addr_free(disp->addr);
            disp->unixdomain = true;
            disp->addr = ux;
            /* Fill in the rest in a moment */
        }
    }

    if (disp->unixdomain) {
        if (!disp->addr)
            disp->addr = platform_get_x11_unix_address(disp->unixsocketpath,
                                                       disp->displaynum);
        if (disp->unixsocketpath)
            disp->realhost = dupstr(disp->unixsocketpath);
        else
            disp->realhost = dupprintf("unix:%d", disp->displaynum);
        disp->port = 0;
    }

    /*
     * Fetch the local authorisation details.
     */
    disp->localauthproto = X11_NO_AUTH;
    disp->localauthdata = NULL;
    disp->localauthdatalen = 0;
    platform_get_x11_auth(disp, conf);

    return disp;
}